

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5047c::createDFDPackedTest3_FormatRGB565_Test::TestBody
          (createDFDPackedTest3_FormatRGB565_Test *this)

{
  createDFDTestBaseUncomp<3U,_2U> *pcVar1;
  createDFDTestBase<3U,_2U> *pcVar2;
  int iVar3;
  uint *lhs;
  pointer *__ptr;
  char *pcVar4;
  AssertionResult gtest_ar;
  int channels [4];
  int bits [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  *(undefined4 *)
   &(this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
    super_createDFDTestBase<3U,_2U>.expected.field_0x8 = 0x10101;
  *(undefined8 *)
   (this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
   super_createDFDTestBase<3U,_2U>.expected.samples = 0x2040000;
  pcVar1 = &(this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>;
  (pcVar1->super_createDFDTestBase<3U,_2U>).expected.samples[0].lower = 0;
  (pcVar1->super_createDFDTestBase<3U,_2U>).expected.samples[0].upper = 0x1f;
  *(undefined8 *)
   ((this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
    super_createDFDTestBase<3U,_2U>.expected.samples + 1) = 0x1050005;
  pcVar2 = &(this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
            super_createDFDTestBase<3U,_2U>;
  (pcVar2->expected).samples[1].lower = 0;
  (pcVar2->expected).samples[1].upper = 0x3f;
  *(undefined8 *)
   ((this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
    super_createDFDTestBase<3U,_2U>.expected.samples + 2) = 0x4000b;
  pcVar2 = &(this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
            super_createDFDTestBase<3U,_2U>;
  (pcVar2->expected).samples[2].lower = 0;
  (pcVar2->expected).samples[2].upper = 0x1f;
  local_28 = 0x600000005;
  uStack_20 = 5;
  local_38 = 2;
  uStack_34 = 1;
  uStack_30 = 0;
  uStack_2c = 0;
  lhs = (uint *)createDFDPacked(0,3,&local_28,&local_38,0);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4c;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_48,"*dfd","sizeof(expected) + 4U",lhs,(unsigned_long *)&local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x1d5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  iVar3 = memcmp(&(this->super_createDFDPackedTest3).super_createDFDTestBaseUncomp<3U,_2U>.
                  super_createDFDTestBase<3U,_2U>.expected,lhs + 1,0x48);
  local_58._M_head_impl._0_4_ = iVar3;
  local_50.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"memcmp(&expected, dfd+1, sizeof(expected))","0",(int *)&local_58,
             (int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x1d6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  free(lhs);
  return;
}

Assistant:

TEST_F(createDFDPackedTest3, FormatRGB565) {
    customize(KHR_DF_MODEL_RGBSDA, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              {
                {0, 4, KHR_DF_CHANNEL_RGBSDA_BLUE, 0, 0, 0, 0, 0, 31},
                {5, 5, KHR_DF_CHANNEL_RGBSDA_GREEN, 0, 0, 0, 0, 0, 63},
                {11, 4, KHR_DF_CHANNEL_RGBSDA_RED, 0, 0, 0, 0, 0, 31},
              }
             );

    // In order from LSB.
    int bits[] = {5, 6, 5, 0};
    int channels[] = {
        KHR_DF_CHANNEL_RGBSDA_BLUE,
        KHR_DF_CHANNEL_RGBSDA_GREEN,
        KHR_DF_CHANNEL_RGBSDA_RED,
        0
    };
    uint32_t* dfd = createDFDPacked(KTX_FALSE, 3, bits, channels, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}